

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

void __thiscall
absl::lts_20250127::SubstituteAndAppend
          (lts_20250127 *this,Nonnull<std::string_*> output,string_view format,Arg *a0,Arg *a1,
          Arg *a2,Arg *a3,Arg *a4)

{
  string_view format_00;
  undefined1 local_88 [8];
  string_view args [5];
  Arg *a2_local;
  Arg *a1_local;
  Arg *a0_local;
  Nonnull<std::string_*> output_local;
  string_view format_local;
  
  format_00._M_len = format._M_len;
  args[4]._M_str = (char *)a1;
  _local_88 = substitute_internal::Arg::piece((Arg *)format._M_str);
  args._8_16_ = (undefined1  [16])substitute_internal::Arg::piece(a0);
  args._24_16_ = (undefined1  [16])substitute_internal::Arg::piece((Arg *)args[4]._M_str);
  args._40_16_ = (undefined1  [16])substitute_internal::Arg::piece(a2);
  args._56_16_ = (undefined1  [16])substitute_internal::Arg::piece(a3);
  format_00._M_str = local_88;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)this,output,format_00,(Nullable<const_absl::string_view_*>)0x5,
             (size_t)a1);
  return;
}

Assistant:

inline void SubstituteAndAppend(absl::Nonnull<std::string*> output,
                                absl::string_view format,
                                const substitute_internal::Arg& a0,
                                const substitute_internal::Arg& a1,
                                const substitute_internal::Arg& a2,
                                const substitute_internal::Arg& a3,
                                const substitute_internal::Arg& a4) {
  const absl::string_view args[] = {a0.piece(), a1.piece(), a2.piece(),
                                    a3.piece(), a4.piece()};
  substitute_internal::SubstituteAndAppendArray(output, format, args,
                                                ABSL_ARRAYSIZE(args));
}